

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackMemory.cpp
# Opt level: O0

void __thiscall Lodtalk::StackMemory::~StackMemory(StackMemory *this)

{
  StackPage *this_00;
  bool bVar1;
  reference ppSVar2;
  StackPage *page;
  iterator __end1;
  iterator __begin1;
  vector<Lodtalk::StackPage_*,_std::allocator<Lodtalk::StackPage_*>_> *__range1;
  StackMemory *this_local;
  
  if (this->stackMemoryLowest != (uint8_t *)0x0) {
    operator_delete__(this->stackMemoryLowest);
  }
  __end1 = std::vector<Lodtalk::StackPage_*,_std::allocator<Lodtalk::StackPage_*>_>::begin
                     (&this->stackPages);
  page = (StackPage *)
         std::vector<Lodtalk::StackPage_*,_std::allocator<Lodtalk::StackPage_*>_>::end
                   (&this->stackPages);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Lodtalk::StackPage_**,_std::vector<Lodtalk::StackPage_*,_std::allocator<Lodtalk::StackPage_*>_>_>
                                *)&page);
    if (!bVar1) break;
    ppSVar2 = __gnu_cxx::
              __normal_iterator<Lodtalk::StackPage_**,_std::vector<Lodtalk::StackPage_*,_std::allocator<Lodtalk::StackPage_*>_>_>
              ::operator*(&__end1);
    this_00 = *ppSVar2;
    if (this_00 != (StackPage *)0x0) {
      StackPage::~StackPage(this_00);
      operator_delete(this_00);
    }
    __gnu_cxx::
    __normal_iterator<Lodtalk::StackPage_**,_std::vector<Lodtalk::StackPage_*,_std::allocator<Lodtalk::StackPage_*>_>_>
    ::operator++(&__end1);
  }
  StackFrame::~StackFrame(&this->stackFrame);
  std::vector<Lodtalk::StackPage_*,_std::allocator<Lodtalk::StackPage_*>_>::~vector
            (&this->freePages);
  std::vector<Lodtalk::StackPage_*,_std::allocator<Lodtalk::StackPage_*>_>::~vector
            (&this->stackPages);
  return;
}

Assistant:

StackMemory::~StackMemory()
{
    delete[] stackMemoryLowest;

    for (auto page : stackPages)
        delete page;
}